

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_tri_grad_nodes(REF_NODE ref_node,REF_INT *nodes,REF_DBL *scalar,REF_DBL *gradient)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_DBL *pRVar4;
  double dVar5;
  uint uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  REF_DBL area2;
  REF_DBL norm02 [3];
  REF_DBL edge01 [3];
  REF_DBL edge02 [3];
  REF_DBL norm01 [3];
  REF_DBL grad2 [3];
  REF_DBL grad1 [3];
  double local_130;
  double local_128 [4];
  double local_108 [4];
  double local_e8 [4];
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88 [4];
  REF_DBL local_68 [4];
  REF_DBL local_48 [4];
  
  *gradient = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  uVar6 = ref_node_tri_area(ref_node,nodes,&local_130);
  if (uVar6 == 0) {
    local_130 = local_130 + local_130;
    pRVar4 = ref_node->real;
    iVar1 = nodes[1];
    iVar2 = *nodes;
    lVar7 = 0;
    do {
      local_108[lVar7] = pRVar4[(long)iVar1 * 0xf + lVar7] - pRVar4[(long)iVar2 * 0xf + lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    pRVar4 = ref_node->real;
    iVar1 = nodes[2];
    iVar2 = *nodes;
    lVar7 = 0;
    do {
      local_e8[lVar7] = pRVar4[(long)iVar1 * 0xf + lVar7] - pRVar4[(long)iVar2 * 0xf + lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    local_88[2] = local_108[2];
    local_88[0] = local_108[0];
    local_88[1] = local_108[1];
    local_128[0] = local_e8[0];
    local_128[1] = local_e8[1];
    local_128[2] = local_e8[2];
    local_90 = local_130;
    uVar6 = ref_math_normalize(local_88);
    if (uVar6 == 0) {
      uVar6 = ref_math_normalize(local_128);
      if (uVar6 == 0) {
        local_a8 = local_108[1];
        dVar5 = local_128[1] * local_108[1];
        local_98 = local_108[0];
        dVar8 = local_128[0] * local_108[0];
        dVar10 = local_128[2] * local_108[2];
        local_b8 = local_e8[1];
        local_b0 = local_e8[0];
        local_c8 = local_e8[2];
        uStack_c0 = 0;
        dVar9 = local_e8[2] * local_e8[2] + local_e8[0] * local_e8[0] + local_e8[1] * local_e8[1];
        local_a0 = local_108[2];
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        lVar7 = 0;
        do {
          local_48[lVar7] = local_128[lVar7] * -(dVar10 + dVar8 + dVar5) + local_108[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        uVar6 = ref_math_normalize(local_48);
        if (uVar6 == 0) {
          lVar7 = 0;
          do {
            local_48[lVar7] = local_48[lVar7] * dVar9;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          dVar9 = local_c8 * local_88[2] + local_b0 * local_88[0] + local_b8 * local_88[1];
          dVar5 = local_a0 * local_a0 + local_98 * local_98 + local_a8 * local_a8;
          if (dVar5 < 0.0) {
            local_c8 = dVar9;
            dVar5 = sqrt(dVar5);
            dVar9 = local_c8;
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          lVar7 = 0;
          do {
            local_68[lVar7] = local_88[lVar7] * -dVar9 + local_e8[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          uVar6 = ref_math_normalize(local_68);
          if (uVar6 == 0) {
            lVar7 = 0;
            do {
              local_68[lVar7] = local_68[lVar7] * dVar5;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            iVar1 = nodes[1];
            iVar2 = *nodes;
            iVar3 = nodes[2];
            lVar7 = 0;
            do {
              gradient[lVar7] =
                   (scalar[iVar1] - scalar[iVar2]) * local_48[lVar7] +
                   (scalar[iVar3] - scalar[iVar2]) * local_68[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            dVar5 = local_90 * 1e+20;
            if (dVar5 <= -dVar5) {
              dVar5 = -dVar5;
            }
            dVar9 = *gradient;
            dVar8 = dVar9;
            if (dVar9 <= -dVar9) {
              dVar8 = -dVar9;
            }
            if (dVar8 < dVar5) {
              dVar8 = gradient[1];
              dVar10 = dVar8;
              if (dVar8 <= -dVar8) {
                dVar10 = -dVar8;
              }
              if (dVar10 < dVar5) {
                dVar10 = gradient[2];
                dVar11 = dVar10;
                if (dVar10 <= -dVar10) {
                  dVar11 = -dVar10;
                }
                if (dVar11 < dVar5) {
                  *gradient = dVar9 / local_90;
                  gradient[1] = dVar8 / local_90;
                  gradient[2] = dVar10 / local_90;
                  return 0;
                }
              }
            }
            *gradient = 0.0;
            gradient[1] = 0.0;
            gradient[2] = 0.0;
            uVar6 = 4;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0xcea,"ref_node_tri_grad_nodes",(ulong)uVar6,"normalize zero length grad2");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xce4,"ref_node_tri_grad_nodes",(ulong)uVar6,"normalize zero length grad1");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xcdf,"ref_node_tri_grad_nodes",(ulong)uVar6,"normalize zero length n0 -> n2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xcde,
             "ref_node_tri_grad_nodes",(ulong)uVar6,"normalize zero length n0 -> n1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xcd2,
           "ref_node_tri_grad_nodes",(ulong)uVar6,"area");
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_grad_nodes(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *scalar, REF_DBL *gradient) {
  REF_DBL area2, dot, side_length;
  REF_DBL grad1[3], grad2[3], edge02[3], edge01[3], norm02[3], norm01[3];
  REF_INT i;
  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_tri_area(ref_node, nodes, &area2), "area");
  area2 *= 2;

  for (i = 0; i < 3; i++)
    edge01[i] = ref_node_xyz(ref_node, i, nodes[1]) -
                ref_node_xyz(ref_node, i, nodes[0]);
  for (i = 0; i < 3; i++)
    edge02[i] = ref_node_xyz(ref_node, i, nodes[2]) -
                ref_node_xyz(ref_node, i, nodes[0]);

  for (i = 0; i < 3; i++) norm01[i] = edge01[i];
  for (i = 0; i < 3; i++) norm02[i] = edge02[i];
  RSS(ref_math_normalize(norm01), "normalize zero length n0 -> n1");
  RSS(ref_math_normalize(norm02), "normalize zero length n0 -> n2");

  dot = ref_math_dot(edge01, norm02);
  side_length = sqrt(ref_math_dot(edge02, edge02));
  for (i = 0; i < 3; i++) grad1[i] = edge01[i] - dot * norm02[i];
  RSS(ref_math_normalize(grad1), "normalize zero length grad1");
  for (i = 0; i < 3; i++) grad1[i] *= side_length;

  dot = ref_math_dot(edge02, norm01);
  side_length = sqrt(ref_math_dot(edge01, edge01));
  for (i = 0; i < 3; i++) grad2[i] = edge02[i] - dot * norm01[i];
  RSS(ref_math_normalize(grad2), "normalize zero length grad2");
  for (i = 0; i < 3; i++) grad2[i] *= side_length;

  for (i = 0; i < 3; i++)
    gradient[i] = (scalar[nodes[1]] - scalar[nodes[0]]) * grad1[i] +
                  (scalar[nodes[2]] - scalar[nodes[0]]) * grad2[i];

  if (ref_math_divisible(gradient[0], area2) &&
      ref_math_divisible(gradient[1], area2) &&
      ref_math_divisible(gradient[2], area2)) {
    gradient[0] /= area2;
    gradient[1] /= area2;
    gradient[2] /= area2;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}